

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

string * __thiscall Tokenizer::readRelOp_abi_cxx11_(string *__return_storage_ptr__,Tokenizer *this)

{
  ifstream *piVar1;
  undefined8 in_RAX;
  long *plVar2;
  char c;
  char local_21;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)this->inStream);
    local_21 = (char)((ulong)in_RAX >> 0x38);
    if (((*(byte *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x20) & 5) != 0) ||
       (local_21 == ' ')) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  if (__return_storage_ptr__->_M_string_length < 3) {
    piVar1 = this->inStream;
    if (*(int *)(piVar1 + *(long *)(*(long *)piVar1 + -0x18) + 0x20) == 0) {
      std::istream::putback((char)piVar1);
    }
    return __return_storage_ptr__;
  }
  std::operator<<((ostream *)&std::cout,"Invalid Operator.\n");
  exit(1);
}

Assistant:

std::string Tokenizer::readRelOp(){
    std::string op;
    char c;
    while(inStream.get(c) && c != ' '){
        op += c;
    }
    if(op.length() > 2) {
        std::cout << "Invalid Operator.\n";
        exit(1);
    }
    if(inStream.good())  // In the loop, we have read one char too many.
        inStream.putback(c);
    return op;
}